

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::InternalCopyNativeFloatArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptNativeFloatArray *srcArray,
               uint32 start,uint32 end)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  Var newValue;
  ulong uVar5;
  uint uVar6;
  uint32 count;
  double value;
  undefined1 local_50 [8];
  ArrayElementEnumerator e;
  
  e._16_8_ = dstArray;
  if ((end <= start) ||
     ((srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length < end))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2d85,"(start < end && end <= srcArray->length)",
                                "start < end && end <= srcArray->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  scriptContext = *(ScriptContext **)(*(long *)(*(long *)(e._16_8_ + 8) + 8) + 0x490);
  ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_50,(JavascriptArray *)srcArray,start,end);
  if (local_50 == (undefined1  [8])0x0) {
    count = 0;
  }
  else {
    count = 0;
LAB_00b83f6b:
    uVar5 = (ulong)(uint)e.seg;
    while( true ) {
      uVar6 = (int)uVar5 + 1;
      if (uVar6 < e.seg._4_4_) {
        uVar6 = e.seg._4_4_;
      }
      while (uVar6 - 1 != (int)uVar5) {
        e.seg._0_4_ = (int)uVar5 + 1;
        uVar5 = (ulong)(uint)e.seg;
        if (*(undefined1 **)(&((SparseArraySegmentBase *)((long)local_50 + 0x18))->left + uVar5 * 2)
            != &DAT_fff80002fff80002) {
          uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_50);
          value = ArrayElementEnumerator::GetItem<double>((ArrayElementEnumerator *)local_50);
          newValue = JavascriptNumber::ToVarWithCheck(value,scriptContext);
          DirectSetItemAt<void*>((JavascriptArray *)e._16_8_,uVar3 + (dstIndex - start),newValue);
          count = count + 1;
          if (local_50 == (undefined1  [8])0x0) goto LAB_00b8400b;
          goto LAB_00b83f6b;
        }
      }
      local_50 = (undefined1  [8])((Type *)((long)local_50 + 0x10))->ptr;
      e.seg._0_4_ = uVar6;
      if (local_50 == (undefined1  [8])0x0) goto LAB_00b8400b;
      uVar6 = e.endIndex - ((SparseArraySegmentBase *)local_50)->left;
      if (e.endIndex < ((SparseArraySegmentBase *)local_50)->left || uVar6 == 0) break;
      e.seg._4_4_ = ((SparseArraySegmentBase *)local_50)->length;
      if (uVar6 < ((SparseArraySegmentBase *)local_50)->length) {
        e.seg._4_4_ = uVar6;
      }
      uVar5 = 0xffffffff;
    }
    local_50 = (undefined1  [8])0x0;
  }
LAB_00b8400b:
  if (count + start != end) {
    InternalFillFromPrototype
              ((JavascriptArray *)e._16_8_,dstIndex,(JavascriptArray *)srcArray,start,end,count);
  }
  return;
}

Assistant:

void JavascriptArray::InternalCopyNativeFloatArrayElements(JavascriptArray* dstArray, uint32 dstIndex, JavascriptNativeFloatArray* srcArray, uint32 start, uint32 end)
    {
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ScriptContext *scriptContext = dstArray->GetScriptContext();
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<double>())
        {
            uint32 n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, JavascriptNumber::ToVarWithCheck(e.GetItem<double>(), scriptContext));
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            InternalFillFromPrototype(dstArray, dstIndex, srcArray, start, end, count);
        }
    }